

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O0

void __thiscall n_e_s::nes::Nes::load_rom(Nes *this,istream *bytestream)

{
  pointer *this_00;
  pointer pIVar1;
  pointer pIVar2;
  pointer ppu;
  pointer controller1;
  pointer controller2;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_90;
  undefined1 local_78 [8];
  MemBankList cpu_membanks;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_50;
  undefined1 local_38 [8];
  MemBankList ppu_membanks;
  istream *bytestream_local;
  Nes *this_local;
  
  this_00 = &ppu_membanks.
             super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  core::RomFactory::from_bytes((RomFactory *)this_00,bytestream);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator=
            (&this->rom_,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)this_00);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)this_00);
  pIVar1 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::get
                     (&this->rom_);
  core::MemBankFactory::create_nes_ppu_mem_banks((MemBankList *)local_38,pIVar1);
  pIVar2 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&this->ppu_mmu_);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector(&local_50,(MemBankList *)local_38);
  (*pIVar2->_vptr_IMmu[2])(pIVar2,&local_50);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_50);
  ppu = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::get
                  (&this->ppu_);
  pIVar1 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::get
                     (&this->rom_);
  controller1 = std::
                unique_ptr<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
                ::get(&this->controller1_);
  controller2 = std::
                unique_ptr<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
                ::get(&this->controller2_);
  core::MemBankFactory::create_nes_mem_banks
            ((MemBankList *)local_78,ppu,pIVar1,controller1,controller2);
  pIVar2 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&this->mmu_);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector(&local_90,
           (vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
            *)local_78);
  (*pIVar2->_vptr_IMmu[2])(pIVar2,&local_90);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_90);
  reset(this);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector((vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             *)local_78);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector((vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Nes::load_rom(std::istream &bytestream) {
    rom_ = RomFactory::from_bytes(bytestream);

    MemBankList ppu_membanks{
            MemBankFactory::create_nes_ppu_mem_banks(rom_.get())};
    ppu_mmu_->set_mem_banks(std::move(ppu_membanks));

    MemBankList cpu_membanks{MemBankFactory::create_nes_mem_banks(
            ppu_.get(), rom_.get(), controller1_.get(), controller2_.get())};
    mmu_->set_mem_banks(std::move(cpu_membanks));

    reset();
}